

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall JSON::Parser::skipLineComment(Parser *this)

{
  bool bVar1;
  int iVar2;
  int code;
  Parser *this_local;
  
  iVar2 = getCodeAt(this,this->pos);
  if ((iVar2 == 0x2f) && (iVar2 = getCodeAt(this,this->pos + 1), iVar2 == 0x2f)) {
    this->pos = this->pos + 1;
    do {
      bVar1 = isValidPos(this);
      if (!bVar1) {
        return;
      }
      iVar2 = this->pos + 1;
      this->pos = iVar2;
      iVar2 = getCodeAt(this,iVar2);
    } while (iVar2 != 10);
    this->pos = this->pos + 1;
  }
  return;
}

Assistant:

void Parser::skipLineComment() {
        int code = getCodeAt(pos);
        if (code == 47 && getCodeAt(pos + 1) == 47) { // '//'
            pos++;
            while (isValidPos()) {
                code = getCodeAt(++pos);
                if (code == 10) { // '\n'
                    pos++;
                    break;
                }
            }
        }
    }